

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghpatexpress.cc
# Opt level: O1

void __thiscall
EqualEquation::genPattern
          (EqualEquation *this,vector<TokenPattern,_std::allocator<TokenPattern>_> *ops)

{
  TokenPattern *this_00;
  PatternExpression *pPVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ulong uVar7;
  LowlevelError *this_01;
  pointer ppTVar8;
  ulong uVar9;
  bool bVar10;
  vector<long,_std::allocator<long>_> cur;
  vector<long,_std::allocator<long>_> min;
  vector<long,_std::allocator<long>_> max;
  vector<const_PatternValue_*,_std::allocator<const_PatternValue_*>_> semval;
  vector<long,_std::allocator<long>_> local_f8;
  TokenPattern local_e0;
  vector<long,_std::allocator<long>_> local_b8;
  long *local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  long local_80;
  vector<const_PatternValue_*,_std::allocator<const_PatternValue_*>_> local_78;
  TokenPattern local_58;
  long lVar6;
  
  iVar3 = (*(((this->super_ValExpressEquation).lhs)->super_PatternExpression).
            _vptr_PatternExpression[10])();
  iVar4 = (*(((this->super_ValExpressEquation).lhs)->super_PatternExpression).
            _vptr_PatternExpression[0xb])();
  local_80 = CONCAT44(extraout_var_00,iVar4);
  local_78.super__Vector_base<const_PatternValue_*,_std::allocator<const_PatternValue_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.super__Vector_base<const_PatternValue_*,_std::allocator<const_PatternValue_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.super__Vector_base<const_PatternValue_*,_std::allocator<const_PatternValue_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_88 = 0;
  local_98 = (long *)0x0;
  uStack_90 = 0;
  local_f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start
       = (long *)0x0;
  local_f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  (*((this->super_ValExpressEquation).rhs)->_vptr_PatternExpression[4])();
  pPVar1 = (this->super_ValExpressEquation).rhs;
  (*pPVar1->_vptr_PatternExpression[5])(pPVar1,&local_b8,&local_98);
  std::vector<long,_std::allocator<long>_>::operator=(&local_f8,&local_b8);
  this_00 = &(this->super_ValExpressEquation).super_PatternEquation.resultpattern;
  iVar4 = 0;
LAB_0032dc5e:
  do {
    pPVar1 = (this->super_ValExpressEquation).rhs;
    local_e0.pattern = (Pattern *)((ulong)local_e0.pattern & 0xffffffff00000000);
    iVar5 = (*pPVar1->_vptr_PatternExpression[6])(pPVar1,&local_f8,&local_e0);
    lVar6 = CONCAT44(extraout_var_01,iVar5);
    if ((CONCAT44(extraout_var,iVar3) <= lVar6) && (lVar6 <= local_80)) {
      if (iVar4 == 0) {
        buildPattern(&local_e0,(this->super_ValExpressEquation).lhs,lVar6,&local_78,&local_f8);
        TokenPattern::operator=(this_00,&local_e0);
        ppTVar8 = local_e0.toklist.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if (local_e0.pattern != (Pattern *)0x0) {
          (*(local_e0.pattern)->_vptr_Pattern[1])();
          ppTVar8 = local_e0.toklist.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
        }
      }
      else {
        buildPattern(&local_58,(this->super_ValExpressEquation).lhs,lVar6,&local_78,&local_f8);
        TokenPattern::doOr(&local_e0,this_00,&local_58);
        TokenPattern::operator=(this_00,&local_e0);
        if (local_e0.pattern != (Pattern *)0x0) {
          (*(local_e0.pattern)->_vptr_Pattern[1])();
        }
        if (local_e0.toklist.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_e0.toklist.super__Vector_base<Token_*,_std::allocator<Token_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
        }
        ppTVar8 = local_58.toklist.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if (local_58.pattern != (Pattern *)0x0) {
          (*(local_58.pattern)->_vptr_Pattern[1])();
          ppTVar8 = local_58.toklist.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
        }
      }
      if (ppTVar8 != (pointer)0x0) {
        operator_delete(ppTVar8);
      }
      iVar4 = iVar4 + 1;
    }
    bVar10 = (long)local_f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_start != 0;
    if (bVar10) {
      uVar7 = (long)local_f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3;
      lVar6 = *local_f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_start;
      *local_f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
       _M_start = lVar6 + 1;
      if (lVar6 < *local_98) goto LAB_0032dc5e;
      uVar2 = 1;
      do {
        uVar9 = uVar2;
        local_f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar9 - 1] =
             local_b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start[uVar9 - 1];
        if (uVar7 + (uVar7 == 0) == uVar9) break;
        lVar6 = local_f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_start[uVar9];
        local_f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar9] = lVar6 + 1;
        uVar2 = uVar9 + 1;
      } while (local_98[uVar9] <= lVar6);
      bVar10 = uVar9 < uVar7;
    }
    if (!bVar10) {
      if (iVar4 == 0) {
        this_01 = (LowlevelError *)__cxa_allocate_exception(0x20);
        local_e0.pattern =
             (Pattern *)
             &local_e0.toklist.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_e0,"Equal constraint is impossible to match","");
        LowlevelError::LowlevelError(this_01,(string *)&local_e0);
        __cxa_throw(this_01,&SleighError::typeinfo,LowlevelError::~LowlevelError);
      }
      if (local_f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_start != (long *)0x0) {
        operator_delete(local_f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_98 != (long *)0x0) {
        operator_delete(local_98);
      }
      if (local_b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_78.super__Vector_base<const_PatternValue_*,_std::allocator<const_PatternValue_*>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_78.
                        super__Vector_base<const_PatternValue_*,_std::allocator<const_PatternValue_*>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      return;
    }
  } while( true );
}

Assistant:

void EqualEquation::genPattern(const vector<TokenPattern> &ops) const

{
  intb lhsmin = lhs->minValue();
  intb lhsmax = lhs->maxValue();
  vector<const PatternValue *> semval;
  vector<intb> min;
  vector<intb> max;
  vector<intb> cur;
  int4 count=0;

  rhs->listValues(semval);
  rhs->getMinMax(min,max);
  cur = min;

  do {
    intb val = rhs->getSubValue(cur);
    if ((val>=lhsmin)&&(val<=lhsmax)) {
      if (count==0)
	resultpattern = buildPattern(lhs,val,semval,cur);
      else
	resultpattern = resultpattern.doOr(buildPattern(lhs,val,semval,cur));
      count += 1;
    }
  } while(advance_combo(cur,min,max));
  if (count == 0)
    throw SleighError("Equal constraint is impossible to match");
}